

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::ComplexTypeInfo::addElement(ComplexTypeInfo *this,SchemaElementDecl *elem)

{
  bool bVar1;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *this_00;
  
  if (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> ==
      (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
    this_00 = (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::SchemaElementDecl>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::SchemaElementDecl> *)this_00,8,false,this->fMemoryManager);
    this->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)this_00;
  }
  else {
    bVar1 = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::containsElement
                      (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,elem)
    ;
    if (bVar1) {
      return;
    }
    this_00 = &this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
  }
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::addElement(this_00,elem);
  return;
}

Assistant:

inline void ComplexTypeInfo::addElement(SchemaElementDecl* const elem) {

    if (!fElements) {
        fElements = new (fMemoryManager) RefVectorOf<SchemaElementDecl>(8, false, fMemoryManager);
    }
    else if (fElements->containsElement(elem)) {
        return;
    }

    fElements->addElement(elem);
}